

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtexture.cpp
# Opt level: O0

int __thiscall
FPNGTexture::CopyTrueColorPixels
          (FPNGTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  BYTE colortype;
  BYTE interlace;
  ushort uVar1;
  ushort uVar2;
  int pitch;
  BYTE BVar3;
  uint chunklen;
  FWadLump *pFVar4;
  FileReader *pFVar5;
  BYTE *buffer;
  undefined8 in_stack_fffffffffffffad0;
  uint uVar6;
  PalEntry *local_4a0;
  BYTE *Pixels;
  int local_488;
  DWORD i_2;
  int i_1;
  int i;
  int local_470;
  int local_46c;
  int transpal;
  int pixwidth;
  FileReader *lump;
  DWORD id;
  DWORD len;
  PalEntry pe [256];
  FCopyInfo *inf_local;
  int rotate_local;
  int y_local;
  int x_local;
  FBitmap *bmp_local;
  FPNGTexture *this_local;
  
  local_4a0 = (PalEntry *)&id;
  do {
    PalEntry::PalEntry(local_4a0);
    local_4a0 = local_4a0 + 1;
  } while (local_4a0 != pe + 0xfe);
  local_46c = (uint)(this->super_FTexture).Width * (int)CopyTrueColorPixels::bpp[this->ColorType];
  local_470 = 0;
  if ((this->super_FTexture).SourceLump < 0) {
    _transpal = (FWadLump *)this->fr;
  }
  else {
    pFVar4 = (FWadLump *)operator_new(0x38);
    FWadCollection::OpenLumpNum(pFVar4,&Wads,(this->super_FTexture).SourceLump);
    _transpal = pFVar4;
  }
  (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])(_transpal,0x21,0);
  for (i_1 = 0; i_1 < 0x100; i_1 = i_1 + 1) {
    BVar3 = (BYTE)i_1;
    PalEntry::PalEntry((PalEntry *)&i_2,0xff,BVar3,BVar3,BVar3);
    (&id)[i_1] = i_2;
  }
  (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
            (_transpal,(long)&lump + 4,4);
  (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])(_transpal,&lump,4);
  while (uVar6 = (uint)((ulong)in_stack_fffffffffffffad0 >> 0x20),
        (int)lump != 0x54414449 && (int)lump != 0x444e4549) {
    lump._4_4_ = BigLong(lump._4_4_);
    if ((int)lump == 0x45544c50) {
      for (local_488 = 0; local_488 < this->PaletteSize; local_488 = local_488 + 1) {
        pFVar5 = FileReader::operator>>
                           (&_transpal->super_FileReader,
                            (BYTE *)((long)&id + (long)local_488 * 4 + 2));
        pFVar5 = FileReader::operator>>(pFVar5,(BYTE *)((long)&id + (long)local_488 * 4 + 1));
        FileReader::operator>>(pFVar5,(BYTE *)(&id + local_488));
      }
    }
    else if ((int)lump == 0x534e5274) {
      if (this->ColorType == '\x03') {
        for (Pixels._4_4_ = 0; Pixels._4_4_ < lump._4_4_; Pixels._4_4_ = Pixels._4_4_ + 1) {
          FileReader::operator>>
                    (&_transpal->super_FileReader,(BYTE *)((long)&id + (ulong)Pixels._4_4_ * 4 + 3))
          ;
          if ((*(char *)((long)&id + (ulong)Pixels._4_4_ * 4 + 3) != '\0') &&
             (*(char *)((long)&id + (ulong)Pixels._4_4_ * 4 + 3) != -1)) {
            local_470 = 1;
          }
        }
      }
      else {
        (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
                  (_transpal,(ulong)lump._4_4_,1);
      }
    }
    else {
      (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
                (_transpal,(ulong)lump._4_4_,1);
    }
    (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])(_transpal,4,1);
    (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
              (_transpal,(long)&lump + 4,4);
    lump._0_4_ = 0x444e4549;
    (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])(_transpal,&lump,4)
    ;
  }
  if (((this->ColorType == '\0') && ((this->HaveTrans & 1U) != 0)) &&
     (this->NonPaletteTrans[0] < 0x100)) {
    *(undefined1 *)((long)&id + (ulong)this->NonPaletteTrans[0] * 4 + 3) = 0;
    local_470 = 1;
  }
  buffer = (BYTE *)operator_new__((long)(int)(local_46c * (uint)(this->super_FTexture).Height));
  (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[4])
            (_transpal,(ulong)this->StartOfIDAT,0);
  (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
            (_transpal,(long)&lump + 4,4);
  (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])(_transpal,&lump,4);
  pFVar4 = _transpal;
  pitch = local_46c;
  uVar1 = (this->super_FTexture).Width;
  uVar2 = (this->super_FTexture).Height;
  BVar3 = this->BitDepth;
  colortype = this->ColorType;
  interlace = this->Interlace;
  chunklen = BigLong(lump._4_4_);
  M_ReadIDAT(&pFVar4->super_FileReader,buffer,(uint)uVar1,(uint)uVar2,pitch,BVar3,colortype,
             interlace,chunklen);
  if ((_transpal != (FWadLump *)this->fr) && (_transpal != (FWadLump *)0x0)) {
    (*(_transpal->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])();
  }
  switch(this->ColorType) {
  case '\0':
  case '\x03':
    (*bmp->_vptr_FBitmap[3])
              (bmp,(ulong)(uint)x,(ulong)(uint)y,buffer,(ulong)(this->super_FTexture).Width,
               (ulong)(this->super_FTexture).Height,1,(uint)(this->super_FTexture).Width,rotate,&id,
               inf);
    break;
  default:
    break;
  case '\x02':
    if ((this->HaveTrans & 1U) == 0) {
      (*bmp->_vptr_FBitmap[2])
                (bmp,(ulong)(uint)x,(ulong)(uint)y,buffer,(ulong)(this->super_FTexture).Width,
                 (ulong)(this->super_FTexture).Height,3,local_46c,rotate,(ulong)uVar6 << 0x20,inf,0,
                 0,0);
    }
    else {
      (*bmp->_vptr_FBitmap[2])
                (bmp,(ulong)(uint)x,(ulong)(uint)y,buffer,(ulong)(this->super_FTexture).Width,
                 (ulong)(this->super_FTexture).Height,3,local_46c,rotate,CONCAT44(uVar6,1),inf,
                 (uint)this->NonPaletteTrans[0],(uint)this->NonPaletteTrans[1],
                 (uint)this->NonPaletteTrans[2]);
      local_470 = 1;
    }
    break;
  case '\x04':
    (*bmp->_vptr_FBitmap[2])
              (bmp,(ulong)(uint)x,(ulong)(uint)y,buffer,(ulong)(this->super_FTexture).Width,
               (ulong)(this->super_FTexture).Height,2,local_46c,rotate,CONCAT44(uVar6,3),inf,0,0,0);
    local_470 = -1;
    break;
  case '\x06':
    (*bmp->_vptr_FBitmap[2])
              (bmp,(ulong)(uint)x,(ulong)(uint)y,buffer,(ulong)(this->super_FTexture).Width,
               (ulong)(this->super_FTexture).Height,4,local_46c,rotate,CONCAT44(uVar6,2),inf,0,0,0);
    local_470 = -1;
  }
  if (buffer != (BYTE *)0x0) {
    operator_delete__(buffer);
  }
  return local_470;
}

Assistant:

int FPNGTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	// Parse pre-IDAT chunks. I skip the CRCs. Is that bad?
	PalEntry pe[256];
	DWORD len, id;
	FileReader *lump;
	static char bpp[] = {1, 0, 3, 1, 2, 0, 4};
	int pixwidth = Width * bpp[ColorType];
	int transpal = false;

	if (SourceLump >= 0)
	{
		lump = new FWadLump(Wads.OpenLumpNum(SourceLump));
	}
	else
	{
		lump = fr;// new FileReader(SourceFile.GetChars());
	}

	lump->Seek(33, SEEK_SET);
	for(int i = 0; i < 256; i++)	// default to a gray map
		pe[i] = PalEntry(255,i,i,i);

	lump->Read(&len, 4);
	lump->Read(&id, 4);
	while (id != MAKE_ID('I','D','A','T') && id != MAKE_ID('I','E','N','D'))
	{
		len = BigLong((unsigned int)len);
		switch (id)
		{
		default:
			lump->Seek (len, SEEK_CUR);
			break;

		case MAKE_ID('P','L','T','E'):
			for(int i = 0; i < PaletteSize; i++)
			{
				(*lump) >> pe[i].r >> pe[i].g >> pe[i].b;
			}
			break;

		case MAKE_ID('t','R','N','S'):
			if (ColorType == 3)
			{
				for(DWORD i = 0; i < len; i++)
				{
					(*lump) >> pe[i].a;
					if (pe[i].a != 0 && pe[i].a != 255)
						transpal = true;
				}
			}
			else
			{
				lump->Seek(len, SEEK_CUR);
			}
			break;
		}
		lump->Seek(4, SEEK_CUR);		// Skip CRC
		lump->Read(&len, 4);
		id = MAKE_ID('I','E','N','D');
		lump->Read(&id, 4);
	}

	if (ColorType == 0 && HaveTrans && NonPaletteTrans[0] < 256)
	{
		pe[NonPaletteTrans[0]].a = 0;
		transpal = true;
	}

	BYTE * Pixels = new BYTE[pixwidth * Height];

	lump->Seek (StartOfIDAT, SEEK_SET);
	lump->Read(&len, 4);
	lump->Read(&id, 4);
	M_ReadIDAT (lump, Pixels, Width, Height, pixwidth, BitDepth, ColorType, Interlace, BigLong((unsigned int)len));
	if (lump != fr) delete lump;

	switch (ColorType)
	{
	case 0:
	case 3:
		bmp->CopyPixelData(x, y, Pixels, Width, Height, 1, Width, rotate, pe, inf);
		break;

	case 2:
		if (!HaveTrans)
		{
			bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 3, pixwidth, rotate, CF_RGB, inf);
		}
		else
		{
			bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 3, pixwidth, rotate, CF_RGBT, inf,
				NonPaletteTrans[0], NonPaletteTrans[1], NonPaletteTrans[2]);
			transpal = true;
		}
		break;

	case 4:
		bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 2, pixwidth, rotate, CF_IA, inf);
		transpal = -1;
		break;

	case 6:
		bmp->CopyPixelDataRGB(x, y, Pixels, Width, Height, 4, pixwidth, rotate, CF_RGBA, inf);
		transpal = -1;
		break;

	default:
		break;

	}
	delete[] Pixels;
	return transpal;
}